

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

void Saig_ManBmcTerSimTestPo(Aig_Man_t *p)

{
  int iVar1;
  void **__ptr;
  Vec_Ptr_t *__ptr_00;
  long lVar2;
  
  __ptr_00 = Saig_ManBmcTerSimPo(p);
  if (__ptr_00 == (Vec_Ptr_t *)0x0) {
    return;
  }
  iVar1 = __ptr_00->nSize;
  __ptr = __ptr_00->pArray;
  if ((long)iVar1 < 1) {
    if (__ptr == (void **)0x0) goto LAB_0056cf35;
  }
  else {
    lVar2 = 0;
    do {
      if ((void *)0x2 < __ptr[lVar2]) {
        free(__ptr[lVar2]);
      }
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  free(__ptr);
LAB_0056cf35:
  free(__ptr_00);
  return;
}

Assistant:

void Saig_ManBmcTerSimTestPo( Aig_Man_t * p )
{
    Vec_Ptr_t * vInfos;
    vInfos = Saig_ManBmcTerSimPo( p );
    Vec_PtrFreeFree( vInfos );
}